

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

Vec_Wec_t * Gia_ManComputeMffcs(Gia_Man_t *p,int LimitMin,int LimitMax,int SuppMax,int RatioBest)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Wec_t *p_02;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pGVar6;
  int i;
  int iVar7;
  ulong uVar8;
  Vec_Int_t *pVVar9;
  int iVar10;
  
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                  ,0x67,"Vec_Wec_t *Gia_ManComputeMffcs(Gia_Man_t *, int, int, int, int)");
  }
  iVar7 = LimitMax * 2;
  pVVar5 = Vec_IntAlloc(iVar7);
  p_00 = Vec_IntAlloc(iVar7);
  p_01 = Vec_IntAlloc(iVar7);
  p_02 = Vec_WecAlloc(1000);
  Gia_ManCreateRefs(p);
  for (iVar7 = 0; iVar7 < p->nObjs; iVar7 = iVar7 + 1) {
    pObj = Gia_ManObj(p,iVar7);
    if (pObj == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
      iVar2 = Gia_ObjId(p,pObj);
      if (p->pRefs[iVar2] != 0) {
        pVVar5->nSize = 0;
        pGVar6 = pObj;
        iVar2 = Gia_ObjCheckMffc_rec(p,pObj,LimitMax,pVVar5);
        if (iVar2 != 0) {
          p_00->nSize = 0;
          p_01->nSize = 0;
          Vec_IntSort(pVVar5,(int)pGVar6);
          for (iVar10 = 0; iVar10 < pVVar5->nSize; iVar10 = iVar10 + 1) {
            iVar3 = Vec_IntEntry(pVVar5,iVar10);
            if (p->pRefs[iVar3] < 1) {
              pGVar6 = Gia_ManObj(p,iVar3);
              if ((~*(uint *)pGVar6 & 0x9fffffff) == 0) goto LAB_0061272d;
              pVVar9 = p_01;
              if (p_01->nSize != 0) {
                iVar4 = Vec_IntEntryLast(p_01);
                goto LAB_00612741;
              }
LAB_00612745:
              Vec_IntPush(pVVar9,iVar3);
            }
            else {
LAB_0061272d:
              pVVar9 = p_00;
              if (p_00->nSize == 0) goto LAB_00612745;
              iVar4 = Vec_IntEntryLast(p_00);
LAB_00612741:
              if (iVar4 != iVar3) goto LAB_00612745;
            }
          }
          iVar10 = Gia_ObjId(p,pObj);
          Vec_IntPush(p_01,iVar10);
        }
        for (iVar10 = 0; iVar10 < pVVar5->nSize; iVar10 = iVar10 + 1) {
          iVar3 = Vec_IntEntry(pVVar5,iVar10);
          p->pRefs[iVar3] = p->pRefs[iVar3] + 1;
        }
        if (((iVar2 != 0) && (iVar2 = p_01->nSize, LimitMin <= iVar2)) &&
           (iVar10 = p_00->nSize, iVar10 <= SuppMax)) {
          iVar3 = p_02->nSize;
          if (iVar3 == p_02->nCap) {
            iVar4 = iVar3 * 2;
            if (iVar3 < 0x10) {
              iVar4 = 0x10;
            }
            Vec_WecGrow(p_02,iVar4);
            iVar3 = p_02->nSize;
          }
          p_02->nSize = iVar3 + 1U;
          if (iVar3 < 0) {
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                          ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
          }
          pVVar9 = p_02->pArray + ((ulong)(iVar3 + 1U) - 1);
          Vec_IntGrow(pVVar9,iVar2 + iVar10 + 0x14);
          Vec_IntPush(pVVar9,iVar7);
          Vec_IntPush(pVVar9,iVar10);
          Vec_IntPush(pVVar9,iVar2);
          Vec_IntAppend(pVVar9,p_00);
          Vec_IntPush(pVVar9,(iVar2 * 1000) / iVar10);
        }
      }
    }
  }
  Vec_IntFree(pVVar5);
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  iVar7 = p_02->nSize;
  qsort(p_02->pArray,(long)iVar7,0x10,Vec_WecSortCompare6);
  iVar10 = 0;
  iVar2 = 0;
  if (0 < iVar7) {
    iVar2 = iVar7;
  }
  for (; iVar2 != iVar10; iVar10 = iVar10 + 1) {
    pVVar5 = Vec_WecEntry(p_02,iVar10);
    if (pVVar5->nSize < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
    }
    pVVar5->nSize = pVVar5->nSize + -1;
  }
  uVar1 = (long)(RatioBest * iVar7) / 100;
  uVar8 = uVar1 & 0xffffffff;
  while (iVar2 = (int)uVar8, iVar2 < iVar7) {
    pVVar5 = Vec_WecEntry(p_02,iVar2);
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      pVVar5->pArray = (int *)0x0;
    }
    pVVar5->nCap = 0;
    pVVar5->nSize = 0;
    uVar8 = (ulong)(iVar2 + 1);
  }
  if ((int)uVar1 <= iVar7) {
    uVar8 = uVar1 & 0xffffffff;
    while (iVar2 = (int)uVar8, iVar7 != iVar2) {
      pVVar5 = Vec_WecEntry(p_02,iVar2);
      Vec_IntShrink(pVVar5,0);
      uVar8 = (ulong)(iVar2 + 1);
    }
    p_02->nSize = (int)uVar1;
    return p_02;
  }
  __assert_fail("iPivot <= Vec_WecSize(vMffcs)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                ,0x8e,"Vec_Wec_t *Gia_ManComputeMffcs(Gia_Man_t *, int, int, int, int)");
}

Assistant:

Vec_Wec_t * Gia_ManComputeMffcs( Gia_Man_t * p, int LimitMin, int LimitMax, int SuppMax, int RatioBest )
{
    Gia_Obj_t * pObj;
    Vec_Wec_t * vMffcs;
    Vec_Int_t * vNodes, * vLeaves, * vInners, * vMffc;
    int i, iPivot;
    assert( p->pMuxes );
    vNodes  = Vec_IntAlloc( 2 * LimitMax );
    vLeaves = Vec_IntAlloc( 2 * LimitMax );
    vInners = Vec_IntAlloc( 2 * LimitMax );
    vMffcs  = Vec_WecAlloc( 1000 );
    Gia_ManCreateRefs( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !Gia_ObjRefNum(p, pObj) )
            continue;
        if ( !Gia_ObjCheckMffc(p, pObj, LimitMax, vNodes, vLeaves, vInners) )
            continue;
        if ( Vec_IntSize(vInners) < LimitMin )
            continue;
        if ( Vec_IntSize(vLeaves) > SuppMax )
            continue;
        // improve cut
        // collect cut
        vMffc = Vec_WecPushLevel( vMffcs );
        Vec_IntGrow( vMffc, Vec_IntSize(vLeaves) + Vec_IntSize(vInners) + 20 );
        Vec_IntPush( vMffc, i );
        Vec_IntPush( vMffc, Vec_IntSize(vLeaves) );
        Vec_IntPush( vMffc, Vec_IntSize(vInners) );
        Vec_IntAppend( vMffc, vLeaves );
//        Vec_IntAppend( vMffc, vInners );
        // add last entry equal to the ratio
        Vec_IntPush( vMffc, 1000 * Vec_IntSize(vInners) / Vec_IntSize(vLeaves) );
    }
    Vec_IntFree( vNodes );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vInners );
    // sort MFFCs by their inner/leaf ratio
    Vec_WecSortByLastInt( vMffcs, 1 );
    Vec_WecForEachLevel( vMffcs, vMffc, i )
        Vec_IntPop( vMffc );
    // remove those whose ratio is not good
    iPivot = RatioBest * Vec_WecSize(vMffcs) / 100;
    Vec_WecForEachLevelStart( vMffcs, vMffc, i, iPivot )
        Vec_IntErase( vMffc );
    assert( iPivot <= Vec_WecSize(vMffcs) );
    Vec_WecShrink( vMffcs, iPivot );
    return vMffcs;
}